

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intvars.cc
# Opt level: O0

intvar_values_range_t tchecker::intvar_values_range(intvar_info_t *intvar_info)

{
  integer_t iVar1;
  int iVar2;
  integer_t iVar3;
  overflow_error *this;
  integer_range_t<int> iVar4;
  intvar_values_range_t iVar5;
  intvar_info_t *intvar_info_local;
  
  iVar1 = intvar_info_t::max(intvar_info);
  iVar2 = std::numeric_limits<int>::max();
  if (iVar1 == iVar2) {
    this = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this,"tchecker::intvar_values_range: cannot build range");
    __cxa_throw(this,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  iVar1 = intvar_info_t::min(intvar_info);
  iVar3 = intvar_info_t::max(intvar_info);
  iVar4 = make_integer_range<int>(iVar1,iVar3 + 1);
  iVar5._begin._current = iVar4._begin._current;
  iVar5._end._current = iVar4._end._current;
  return iVar5;
}

Assistant:

tchecker::intvar_values_range_t intvar_values_range(tchecker::intvar_info_t const & intvar_info)
{
  if (intvar_info.max() == std::numeric_limits<tchecker::integer_t>::max())
    throw std::overflow_error("tchecker::intvar_values_range: cannot build range");
  return tchecker::make_integer_range(intvar_info.min(), static_cast<tchecker::integer_t>(intvar_info.max() + 1));
}